

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_All_Time.cpp
# Opt level: O0

bool __thiscall RenX_Ladder_All_TimePlugin::initialize(RenX_Ladder_All_TimePlugin *this)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  undefined1 auVar4 [16];
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  RenX_Ladder_All_TimePlugin *this_local;
  
  bVar2 = sv("LadderDatabase",0xe);
  bVar3 = sv("Ladder.db",9);
  local_30 = bVar2._M_len;
  local_28 = bVar2._M_str;
  local_40 = bVar3._M_len;
  local_38 = bVar3._M_str;
  auVar4 = Jupiter::Config::get(&this->field_0x38,local_30,local_28,local_40,local_38);
  Jupiter::Database::process_file(&this->database,auVar4._0_8_,auVar4._8_8_);
  bVar2 = sv("DatabaseName",0xc);
  bVar3 = sv("All-Time",8);
  local_60 = bVar2._M_len;
  local_58 = bVar2._M_str;
  local_70 = bVar3._M_len;
  local_68 = bVar3._M_str;
  auVar4 = Jupiter::Config::get(&this->field_0x38,local_60,local_58,local_70,local_68);
  RenX::LadderDatabase::setName(&this->database,auVar4._0_8_,auVar4._8_8_);
  bVar2 = sv("OutputTimes",0xb);
  Jupiter::Config::get<bool>((Config *)&this->field_0x38,bVar2,true);
  RenX::LadderDatabase::setOutputTimes((bool)((char)this + -0x60));
  bVar2 = sv("ForceDefault",0xc);
  bVar1 = Jupiter::Config::get<bool>((Config *)&this->field_0x38,bVar2,true);
  if (bVar1) {
    RenX::default_ladder_database = &this->database;
  }
  return true;
}

Assistant:

bool RenX_Ladder_All_TimePlugin::initialize() {
	// Load database
	this->database.process_file(this->config.get("LadderDatabase"sv, "Ladder.db"sv));
	this->database.setName(this->config.get("DatabaseName"sv, "All-Time"sv));
	this->database.setOutputTimes(this->config.get<bool>("OutputTimes"sv, true));

	// Force database to default, if desired
	if (this->config.get<bool>("ForceDefault"sv, true)) {
		RenX::default_ladder_database = &this->database;
	}

	return true;
}